

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O0

int do_gfsp_generic_cmd(int argc,char **argv)

{
  _Bool _Var1;
  int iVar2;
  long lVar3;
  long in_FS_OFFSET;
  uint local_1180;
  uint local_117c;
  uint retries;
  int ret;
  char *outfile;
  char *infile;
  long lStack_1160;
  uint32_t cmd;
  char *device_path;
  size_t local_1150;
  size_t actual_received_size;
  size_t in_buf_size;
  igsc_device_handle handle;
  char **argv_local;
  uint8_t local_1128 [4];
  int argc_local;
  uint8_t out_buf [2048];
  uint8_t in_buf [2048];
  undefined1 local_11e [8];
  igsc_device_info dev_info;
  
  dev_info._262_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  lStack_1160 = 0;
  infile._4_4_ = 0;
  outfile = (char *)0x0;
  _retries = (char *)0x0;
  actual_received_size = 0;
  local_1150 = 0;
  local_1180 = 0;
  handle.ctx = (igsc_lib_ctx *)argv;
  argv_local._4_4_ = argc;
  if (argc < 1) {
    if (!quiet) {
      fprintf(_stderr,"Error: Missing arguments\n");
    }
    device_path._4_4_ = 0xffffffff;
    goto LAB_0010e08b;
  }
  memset(&in_buf_size,0,8);
  do {
    _Var1 = arg_is_device(*(char **)handle.ctx);
    if (_Var1) {
      _Var1 = arg_next((int *)((long)&argv_local + 4),(char ***)&handle);
      if (!_Var1) {
        if ((quiet & 1U) == 0) {
          fprintf(_stderr,"Error: No device was provided\n");
        }
        device_path._4_4_ = 0xffffffff;
        goto LAB_0010e08b;
      }
      lStack_1160 = *(long *)handle.ctx;
    }
    else {
      _Var1 = arg_is_cmd(*(char **)handle.ctx);
      if (_Var1) {
        if (outfile != (char *)0x0) {
          if ((quiet & 1U) == 0) {
            fprintf(_stderr,"Error: The in-file argument appears twice\n");
          }
          device_path._4_4_ = 0xffffffff;
          goto LAB_0010e08b;
        }
        _Var1 = arg_next((int *)((long)&argv_local + 4),(char ***)&handle);
        if (!_Var1) {
          if ((quiet & 1U) == 0) {
            fprintf(_stderr,"Error: No fgsp command value provided\n");
          }
          device_path._4_4_ = 0xffffffff;
          goto LAB_0010e08b;
        }
        lVar3 = atol(*(char **)handle.ctx);
        infile._4_4_ = (int)lVar3;
        if (infile._4_4_ == 0) {
          if ((quiet & 1U) == 0) {
            fprintf(_stderr,"Error: Bad gfsp command value argument \'%s\'\n",
                    *(undefined8 *)handle.ctx);
          }
          device_path._4_4_ = 0xffffffff;
          goto LAB_0010e08b;
        }
      }
      else {
        _Var1 = arg_is_in(*(char **)handle.ctx);
        if (_Var1) {
          _Var1 = arg_next((int *)((long)&argv_local + 4),(char ***)&handle);
          if (!_Var1) {
            if ((quiet & 1U) == 0) {
              fprintf(_stderr,"Error: No in-file name provided\n");
            }
            device_path._4_4_ = 0xffffffff;
            goto LAB_0010e08b;
          }
          outfile = *(char **)handle.ctx;
        }
        else {
          _Var1 = arg_is_out(*(char **)handle.ctx);
          if (!_Var1) {
            if ((quiet & 1U) == 0) {
              fprintf(_stderr,"Error: Wrong argument %s\n",*(undefined8 *)handle.ctx);
            }
            device_path._4_4_ = 0xffffffff;
            goto LAB_0010e08b;
          }
          if (_retries != (char *)0x0) {
            if ((quiet & 1U) == 0) {
              fprintf(_stderr,"Error: The out-file argument appears twice\n");
            }
            device_path._4_4_ = 0xffffffff;
            goto LAB_0010e08b;
          }
          _Var1 = arg_next((int *)((long)&argv_local + 4),(char ***)&handle);
          if (!_Var1) {
            if ((quiet & 1U) == 0) {
              fprintf(_stderr,"Error: No out-file name provided\n");
            }
            device_path._4_4_ = 0xffffffff;
            goto LAB_0010e08b;
          }
          _retries = *(char **)handle.ctx;
        }
      }
    }
    _Var1 = arg_next((int *)((long)&argv_local + 4),(char ***)&handle);
  } while (_Var1);
  if (((infile._4_4_ == 0) || (outfile == (char *)0x0)) || (_retries == (char *)0x0)) {
    if ((quiet & 1U) == 0) {
      fprintf(_stderr,"Error: Not enough arguments\n");
    }
    device_path._4_4_ = 0xffffffff;
    goto LAB_0010e08b;
  }
  if (lStack_1160 == 0) {
    iVar2 = get_first_device_info((igsc_device_info *)local_11e);
    if (iVar2 == 0) {
      iVar2 = igsc_device_init_by_device_info(&in_buf_size,local_11e);
      if (iVar2 == 0) goto LAB_0010de3e;
      local_117c = 1;
      if ((quiet & 1U) == 0) {
        fprintf(_stderr,"Error: Cannot initialize device: %s\n",local_11e);
      }
    }
    else {
      local_117c = 1;
      if ((quiet & 1U) == 0) {
        fprintf(_stderr,"Error: No device to work with\n");
      }
    }
  }
  else {
    iVar2 = igsc_device_init_by_device(&in_buf_size,lStack_1160);
    if (iVar2 == 0) {
LAB_0010de3e:
      iVar2 = read_from_file_to_buf(outfile,out_buf + 0x7f8,0x800,&actual_received_size);
      if (iVar2 != 0) {
        printf("Failed to read file : %s, using empty in buffer\n",outfile);
        actual_received_size = 0;
      }
      printf("Sending %zu bytes of input data by gfsp generic api\n",actual_received_size);
      if (actual_received_size == 0) {
        do {
          local_117c = igsc_gfsp_heci_cmd(&in_buf_size,infile._4_4_,0,0,local_1128,0x800,&local_1150
                                         );
          if (local_117c != 0xd) break;
          gsc_msleep(2000);
          local_1180 = local_1180 + 1;
        } while (local_1180 < 3);
      }
      else {
        do {
          local_117c = igsc_gfsp_heci_cmd(&in_buf_size,infile._4_4_,out_buf + 0x7f8,
                                          actual_received_size,local_1128,0x800,&local_1150);
          if (local_117c != 0xd) break;
          gsc_msleep(2000);
          local_1180 = local_1180 + 1;
        } while (local_1180 < 3);
      }
      printf("Received %zu bytes of data\n",local_1150);
      if ((local_117c != 0) && ((quiet & 1U) == 0)) {
        fprintf(_stderr,"Error: gfsp command failed, return code %d, bytes received %zu\n",
                (ulong)local_117c,local_1150);
      }
      if ((local_117c == 0) || (local_117c == 7)) {
        iVar2 = write_to_file_from_buf(_retries,local_1128,local_1150);
        if (iVar2 == 0) {
          printf("Wrote %zu bytes to %s\n",local_1150,_retries);
        }
        else {
          local_117c = 1;
          if ((quiet & 1U) == 0) {
            fprintf(_stderr,"Error: Failed to write file : %s\n",_retries);
          }
        }
      }
      else if ((quiet & 1U) == 0) {
        fprintf(_stderr,"Error: Wrote nothing to %s\n",_retries);
      }
    }
    else {
      local_117c = 1;
      if ((quiet & 1U) == 0) {
        fprintf(_stderr,"Error: Cannot initialize device: %s\n",lStack_1160);
      }
    }
  }
  igsc_device_close(&in_buf_size);
  device_path._4_4_ = local_117c;
LAB_0010e08b:
  if (*(long *)(in_FS_OFFSET + 0x28) != dev_info._262_8_) {
    __stack_chk_fail();
  }
  return device_path._4_4_;
}

Assistant:

mockable_static
int do_gfsp_generic_cmd(int argc, char *argv[])
{
    struct igsc_device_handle handle;
    const char *device_path = NULL;
    struct igsc_device_info dev_info;
    uint32_t cmd = 0;
    char *infile = NULL, *outfile = NULL;
    uint8_t in_buf[MAX_BUF_SIZE], out_buf[MAX_BUF_SIZE];
    size_t in_buf_size = 0;
    int ret;
    size_t actual_received_size = 0;
    unsigned int retries = 0;

    if (argc <= 0)
    {
        fwupd_error("Missing arguments\n");
        return ERROR_BAD_ARGUMENT;
    }

    memset(&handle, 0, sizeof(handle));

    do
    {
        if (arg_is_device(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No device was provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            device_path = argv[0];
        }
        else if (arg_is_cmd(argv[0]))
        {
            if (infile)
            {
                fwupd_error("The in-file argument appears twice\n");
                return ERROR_BAD_ARGUMENT;
            }
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No fgsp command value provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            cmd = (uint32_t)atol(argv[0]);
            if (!cmd)
            {
                fwupd_error("Bad gfsp command value argument '%s'\n", argv[0]);
                return ERROR_BAD_ARGUMENT;
            }
        }
        else if (arg_is_in(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No in-file name provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            infile = argv[0];
        }
        else if (arg_is_out(argv[0]))
        {
            if (outfile)
            {
                fwupd_error("The out-file argument appears twice\n");
                return ERROR_BAD_ARGUMENT;
            }
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No out-file name provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            outfile = argv[0];
        }
        else
        {
            fwupd_error("Wrong argument %s\n", argv[0]);
            return ERROR_BAD_ARGUMENT;
        }
    } while(arg_next(&argc, &argv));

    if (cmd == 0 || !infile || !outfile)
    {
        fwupd_error("Not enough arguments\n");
        return ERROR_BAD_ARGUMENT;
    }

    if (device_path)
    {
        ret = igsc_device_init_by_device(&handle, device_path);
        if (ret)
        {
           ret = EXIT_FAILURE;
           fwupd_error("Cannot initialize device: %s\n", device_path);
           goto out;
        }
    }
    else
    {
        if (get_first_device_info(&dev_info))
        {
            ret = EXIT_FAILURE;
            fwupd_error("No device to work with\n");
            goto out;
        }

        ret = igsc_device_init_by_device_info(&handle, &dev_info);
        if (ret)
        {
            ret = EXIT_FAILURE;
            fwupd_error("Cannot initialize device: %s\n", dev_info.name);
            goto out;
        }
    }

    if (read_from_file_to_buf(infile, in_buf, sizeof(in_buf), &in_buf_size) != 0)
    {
        printf("Failed to read file : %s, using empty in buffer\n", infile);
        in_buf_size = 0;
    }
    printf("Sending %zu bytes of input data by gfsp generic api\n", in_buf_size);
    if (in_buf_size)
    {
        while ((ret = igsc_gfsp_heci_cmd(&handle, cmd, in_buf, in_buf_size,
                                         out_buf, sizeof(out_buf),
                                         &actual_received_size)) == IGSC_ERROR_BUSY)
        {
            gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
            if (++retries >= MAX_CONNECT_RETRIES)
                break;
        }
    }
    else
    {
        while ((ret = igsc_gfsp_heci_cmd(&handle, cmd, NULL, 0,
                                         out_buf, sizeof(out_buf),
                                         &actual_received_size)) == IGSC_ERROR_BUSY)
        {
            gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
            if (++retries >= MAX_CONNECT_RETRIES)
                break;
        }
    }
    printf("Received %zu bytes of data\n", actual_received_size);
    if (ret)
    {
        fwupd_error("gfsp command failed, return code %d, bytes received %zu\n",
                     ret, actual_received_size);
    }
    if (ret == 0 || ret == IGSC_ERROR_BUFFER_TOO_SMALL)
    {
        /* copy data to the out_buf */
        if (write_to_file_from_buf(outfile, out_buf, actual_received_size) != 0)
        {
            ret = EXIT_FAILURE;
            fwupd_error("Failed to write file : %s\n", outfile);
            goto out;
        }
        printf("Wrote %zu bytes to %s\n", actual_received_size, outfile);
    }
    else
    {
        fwupd_error("Wrote nothing to %s\n", outfile);
    }

out:
    igsc_device_close(&handle);
    return ret;
}